

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O0

QPDFEFStreamObjectHelper *
QPDFEFStreamObjectHelper::createEFStream
          (QPDFEFStreamObjectHelper *__return_storage_ptr__,QPDF *qpdf,string *data)

{
  QPDFObjectHandle local_30;
  string *local_20;
  string *data_local;
  QPDF *qpdf_local;
  
  local_20 = data;
  data_local = (string *)qpdf;
  qpdf_local = (QPDF *)__return_storage_ptr__;
  QPDF::newStream((QPDF *)&local_30,(string *)qpdf);
  newFromStream(__return_storage_ptr__,&local_30);
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  return __return_storage_ptr__;
}

Assistant:

QPDFEFStreamObjectHelper
QPDFEFStreamObjectHelper::createEFStream(QPDF& qpdf, std::string const& data)
{
    return newFromStream(qpdf.newStream(data));
}